

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O3

Action __thiscall
psy::C::TypeChecker::visitIdentifierName(TypeChecker *this,IdentifierNameSyntax *node)

{
  DeclarationCategory DVar1;
  int iVar2;
  Scope *this_00;
  Identifier *ident;
  DeclarationSymbol *this_01;
  MIXIN_TypeableDeclarationSymbol *pMVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  Compilation *pCVar5;
  Type *pTVar6;
  Action AVar7;
  
  this_00 = SemanticModel::scopeOf(this->semaModel_,node);
  if (this_00 == (Scope *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar2 = 0x263;
LAB_002e0843:
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    AVar7 = Quit;
  }
  else {
    ident = identifierFrom(node);
    this_01 = Scope::searchForDeclaration(this_00,ident,OrdinaryIdentifiers);
    if (this_01 == (DeclarationSymbol *)0x0) {
      pCVar5 = SemanticModel::compilation(this->semaModel_);
      pTVar6 = &Compilation::canonicalErrorType(pCVar5)->super_Type;
      this->ty_ = pTVar6;
      return Skip;
    }
    DVar1 = DeclarationSymbol::category(this_01);
    AVar7 = Skip;
    if (DVar1 < Type) {
      pMVar3 = MIXIN_TypeableDeclarationSymbol::from(this_01);
      if (pMVar3 == (MIXIN_TypeableDeclarationSymbol *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                   ,0x5a);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        iVar2 = 0x26f;
        goto LAB_002e0843;
      }
      iVar2 = (*pMVar3->_vptr_MIXIN_TypeableDeclarationSymbol[2])(pMVar3);
      pTVar6 = (Type *)CONCAT44(extraout_var,iVar2);
    }
    else {
      if (DVar1 != Type) {
        return Skip;
      }
      pCVar5 = SemanticModel::compilation(this->semaModel_);
      pTVar6 = &Compilation::canonicalErrorType(pCVar5)->super_Type;
    }
    this->ty_ = pTVar6;
  }
  return AVar7;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitIdentifierName(const IdentifierNameSyntax* node)
{
    auto scope = semaModel_->scopeOf(node);
    PSY_ASSERT_2(scope, return Action::Quit);
    auto decl = scope->searchForDeclaration(
                identifierFrom(node),
                NameSpace::OrdinaryIdentifiers);
    if (!decl)
        ty_ = semaModel_->compilation()->canonicalErrorType();
    else {
        switch (decl->category()) {
            case DeclarationCategory::Member:
            case DeclarationCategory::Function:
            case DeclarationCategory::Object: {
                auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
                PSY_ASSERT_2(typeableDecl, return Action::Quit);
                ty_ = typeableDecl->type();
                break;
            }
            case DeclarationCategory::Type:
                ty_ = semaModel_->compilation()->canonicalErrorType();
                break;
        }
    }

    return Action::Skip;
}